

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

RepeatedPtrFieldBase * __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMap
          (MapFieldBase *this,bool for_mutation)

{
  bool bVar1;
  State SVar2;
  UntypedMapBase *this_00;
  RepeatedPtrFieldBase *pRVar3;
  MutexLock local_38;
  MutexLock lock;
  ReflectionPayload *local_28;
  ReflectionPayload *p;
  bool for_mutation_local;
  MapFieldBase *this_local;
  
  ConstAccess(this);
  SVar2 = state(this);
  if (SVar2 == STATE_MODIFIED_MAP) {
    local_28 = maybe_payload(this);
    if (local_28 == (ReflectionPayload *)0x0) {
      if (!for_mutation) {
        this_00 = GetMapRaw(this);
        bVar1 = UntypedMapBase::empty(this_00);
        if (bVar1) {
          RawPtr<const_google::protobuf::internal::RepeatedPtrFieldBase>::RawPtr
                    ((RawPtr<const_google::protobuf::internal::RepeatedPtrFieldBase> *)&lock);
          pRVar3 = RawPtr<const_google::protobuf::internal::RepeatedPtrFieldBase>::operator*
                             ((RawPtr<const_google::protobuf::internal::RepeatedPtrFieldBase> *)
                              &lock);
          return pRVar3;
        }
      }
      local_28 = payload(this);
    }
    absl::lts_20240722::MutexLock::MutexLock(&local_38,&local_28->mutex);
    SVar2 = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                      (&local_28->state,memory_order_relaxed);
    if (SVar2 == STATE_MODIFIED_MAP) {
      SyncRepeatedFieldWithMapNoLock(this);
      std::atomic<google::protobuf::internal::MapFieldBase::State>::store
                (&local_28->state,CLEAN,memory_order_release);
    }
    absl::lts_20240722::MutexLock::~MutexLock(&local_38);
    ConstAccess(this);
    this_local = (MapFieldBase *)local_28;
  }
  else {
    this_local = (MapFieldBase *)payload(this);
  }
  return (RepeatedPtrFieldBase *)this_local;
}

Assistant:

const RepeatedPtrFieldBase& MapFieldBase::SyncRepeatedFieldWithMap(
    bool for_mutation) const {
  ConstAccess();
  if (state() == STATE_MODIFIED_MAP) {
    auto* p = maybe_payload();
    if (p == nullptr) {
      // If we have no payload, and we do not want to mutate the object, and the
      // map is empty, then do nothing.
      // This prevents modifying global default instances which might be in ro
      // memory.
      if (!for_mutation && GetMapRaw().empty()) {
        return *RawPtr<const RepeatedPtrFieldBase>();
      }
      p = &payload();
    }

    {
      absl::MutexLock lock(&p->mutex);
      // Double check state, because another thread may have seen the same
      // state and done the synchronization before the current thread.
      if (p->state.load(std::memory_order_relaxed) == STATE_MODIFIED_MAP) {
        const_cast<MapFieldBase*>(this)->SyncRepeatedFieldWithMapNoLock();
        p->state.store(CLEAN, std::memory_order_release);
      }
    }
    ConstAccess();
    return reinterpret_cast<const RepeatedPtrFieldBase&>(p->repeated_field);
  }
  return reinterpret_cast<const RepeatedPtrFieldBase&>(
      payload().repeated_field);
}